

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O2

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,GenericForStatement *gen_for,void *data)

{
  int line;
  uint src;
  int iVar1;
  SyntaxTree *pSVar2;
  Function *this_00;
  int src_00;
  int src_01;
  int src_02;
  uint dst;
  int dst_00;
  int dst_01;
  size_t sVar3;
  int name;
  uint dst_02;
  anon_class_16_2_a46cb335 move;
  Guard g_1;
  Guard l;
  NameListData_conflict name_list_data;
  ExpListData_conflict exp_list_data;
  Guard g;
  
  l.leave_.super__Function_base._M_functor._8_8_ = 0;
  l.leave_._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:947:9)>
       ::_M_invoke;
  l.leave_.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:947:9)>
       ::_M_manager;
  g_1.leave_.super__Function_base._M_functor._8_8_ = 0;
  g_1.leave_._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:947:9)>
       ::_M_invoke;
  g_1.leave_.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:947:9)>
       ::_M_manager;
  g_1.leave_.super__Function_base._M_functor._M_unused._M_object = this;
  l.leave_.super__Function_base._M_functor._M_unused._M_object = this;
  Guard::Guard(&g,&l.leave_,&g_1.leave_);
  std::_Function_base::~_Function_base((_Function_base *)&g_1);
  std::_Function_base::~_Function_base((_Function_base *)&l);
  src_00 = GenerateRegisterId(this);
  src_01 = GenerateRegisterId(this);
  src_02 = GenerateRegisterId(this);
  pSVar2 = (gen_for->exp_list_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,this);
  this_00 = this->current_function_->function_;
  line = gen_for->line_;
  g_1.leave_._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:958:9)>
       ::_M_invoke;
  g_1.leave_.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:958:9)>
       ::_M_manager;
  move.line = 0;
  move._12_4_ = 0;
  move.function = (Function *)this;
  g_1.leave_.super__Function_base._M_functor._M_unused._M_object = this;
  g_1.leave_.super__Function_base._M_functor._8_8_ = gen_for;
  Guard::Guard(&l,&g_1.leave_,(function<void_()> *)&move);
  std::_Function_base::~_Function_base((_Function_base *)&move);
  std::_Function_base::~_Function_base((_Function_base *)&g_1);
  move.line = 0;
  move._12_4_ = 0;
  move.function = (Function *)this;
  _name_list_data = this;
  Guard::Guard(&g_1,(function<void_()> *)&move,(function<void_()> *)&name_list_data);
  std::_Function_base::~_Function_base((_Function_base *)&name_list_data);
  std::_Function_base::~_Function_base((_Function_base *)&move);
  src = this->current_function_->register_id_;
  _name_list_data = _name_list_data & 0xffffffffffffff00;
  pSVar2 = (gen_for->name_list_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,this,&name_list_data);
  iVar1 = this->current_function_->register_id_;
  if (iVar1 - src != 0 && (int)src <= iVar1) {
    dst = GenerateRegisterId(this);
    dst_00 = GenerateRegisterId(this);
    dst_01 = GenerateRegisterId(this);
    move.line = line;
    move.function = this_00;
    Visit::anon_class_16_2_a46cb335::operator()(&move,dst,src_00);
    Visit::anon_class_16_2_a46cb335::operator()(&move,dst_00,src_01);
    Visit::anon_class_16_2_a46cb335::operator()(&move,dst_01,src_02);
    Function::AddInstruction
              (this_00,(Instruction)
                       (((iVar1 - src) + 1 & 0xff) + (dst & 0xff) * 0x10000 + 0xc000300),line);
    for (dst_02 = src; (int)dst_02 < iVar1; dst_02 = dst_02 + 1) {
      Visit::anon_class_16_2_a46cb335::operator()(&move,dst_02,dst);
      dst = dst + 1;
    }
    sVar3 = Function::AddInstruction(this_00,(Instruction)((src & 0xff) << 0x10 | 0x11000000),line);
    AddLoopJumpInfo(this,&gen_for->super_SyntaxTree,(int)sVar3,JumpTail);
    Visit::anon_class_16_2_a46cb335::operator()(&move,src_02,src);
    pSVar2 = (gen_for->block_)._M_t.
             super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
             super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
             super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,this,0);
    Guard::~Guard(&g_1);
    sVar3 = Function::AddInstruction(this_00,(Instruction)0x12000000,line);
    AddLoopJumpInfo(this,&gen_for->super_SyntaxTree,(int)sVar3,JumpHead);
    Guard::~Guard(&l);
    Guard::~Guard(&g);
    return;
  }
  __assert_fail("name_start < name_end",
                "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                ,0x3c7,
                "virtual void luna::CodeGenerateVisitor::Visit(GenericForStatement *, void *)");
}

Assistant:

void CodeGenerateVisitor::Visit(GenericForStatement *gen_for, void *data)
    {
        CODE_GENERATE_GUARD(EnterBlock, LeaveBlock);

        // Init generic for statement data
        auto func_register = GenerateRegisterId();
        auto state_register = GenerateRegisterId();
        auto var_register = GenerateRegisterId();
        ExpListData exp_list_data{ func_register, var_register + 1 };
        gen_for->exp_list_->Accept(this, &exp_list_data);

        auto function = GetCurrentFunction();
        auto line = gen_for->line_;
        LOOP_GUARD(gen_for);
        {
            CODE_GENERATE_GUARD(EnterBlock, LeaveBlock);
            
            // Alloca registers for names
            auto name_start = GetNextRegisterId();
            NameListData name_list_data{ false };
            gen_for->name_list_->Accept(this, &name_list_data);
            auto name_end = GetNextRegisterId();
            assert(name_start < name_end);

            // Alloca temp registers for call iterate function
            auto temp_func = GenerateRegisterId();
            auto temp_state = GenerateRegisterId();
            auto temp_var = GenerateRegisterId();

            // Call iterate function
            auto move = [=](int dst, int src) {
                auto instruction = Instruction::ABCode(OpType_Move, dst, src);
                function->AddInstruction(instruction, line);
            };
            move(temp_func, func_register);
            move(temp_state, state_register);
            move(temp_var, var_register);

            auto instruction = Instruction::ABCCode(OpType_Call, temp_func,
                                                    2 + 1,  // Two args
                                                    name_end - name_start + 1);
            function->AddInstruction(instruction, line);

            // Copy results to registers of names
            for (auto name = name_start; name < name_end; ++name, ++temp_func)
                move(name, temp_func);

            // Break the loop when the first name value is nil
            instruction = Instruction::AsBxCode(OpType_JmpNil, name_start, 0);
            int index = function->AddInstruction(instruction, line);
            AddLoopJumpInfo(gen_for, index, LoopJumpInfo::JumpTail);

            // Copy first name value to var_register
            move(var_register, name_start);

            gen_for->block_->Accept(this, nullptr);
        }
        

        // Jump to loop start
        auto instruction = Instruction::AsBxCode(OpType_Jmp, 0, 0);
        int index = function->AddInstruction(instruction, line);
        AddLoopJumpInfo(gen_for, index, LoopJumpInfo::JumpHead);
    }